

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

void __thiscall
irr::video::CNullDriver::draw2DImageBatch
          (CNullDriver *this,ITexture *texture,array<irr::core::vector2d<int>_> *positions,
          array<irr::core::rect<int>_> *sourceRects,rect<int> *clipRect,SColor color,
          bool useAlphaChannelOfTexture)

{
  uint *puVar1;
  vector2d<int> *pvVar2;
  rect<int> *prVar3;
  array<irr::core::rect<int>_> *in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  byte in_stack_00000008;
  u32 i;
  u32 drawCount;
  u32 in_stack_ffffffffffffff9c;
  array<irr::core::rect<int>_> *this_00;
  uint local_44;
  u32 local_40;
  u32 local_3c;
  uint local_38;
  byte local_31;
  undefined8 local_30;
  array<irr::core::rect<int>_> *local_18;
  undefined4 local_4;
  
  local_31 = in_stack_00000008 & 1;
  local_30 = in_R8;
  local_18 = in_RSI;
  local_4 = in_R9D;
  local_3c = core::array<irr::core::vector2d<int>_>::size
                       ((array<irr::core::vector2d<int>_> *)0x30ab60);
  local_40 = core::array<irr::core::rect<int>_>::size((array<irr::core::rect<int>_> *)0x30ab6e);
  puVar1 = core::min_<unsigned_int>(&local_3c,&local_40);
  local_38 = *puVar1;
  for (local_44 = 0; local_44 < local_38; local_44 = local_44 + 1) {
    this_00 = local_18;
    pvVar2 = core::array<irr::core::vector2d<int>_>::operator[]
                       ((array<irr::core::vector2d<int>_> *)local_18,in_stack_ffffffffffffff9c);
    prVar3 = core::array<irr::core::rect<int>_>::operator[](this_00,in_stack_ffffffffffffff9c);
    (**(code **)(*in_RDI + 0x180))(in_RDI,this_00,pvVar2,prVar3,local_30,local_4,local_31 & 1);
  }
  return;
}

Assistant:

void CNullDriver::draw2DImageBatch(const video::ITexture *texture,
		const core::array<core::position2d<s32>> &positions,
		const core::array<core::rect<s32>> &sourceRects,
		const core::rect<s32> *clipRect,
		SColor color,
		bool useAlphaChannelOfTexture)
{
	const irr::u32 drawCount = core::min_<u32>(positions.size(), sourceRects.size());

	for (u32 i = 0; i < drawCount; ++i) {
		draw2DImage(texture, positions[i], sourceRects[i],
				clipRect, color, useAlphaChannelOfTexture);
	}
}